

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_diamond.cc
# Opt level: O2

void produce<long,disruptor::SingleThreadedStrategy,disruptor::YieldingStrategy<200l>>
               (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
                *s)

{
  uint uVar1;
  pointer plVar2;
  ulong uVar3;
  int k;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = 0;
  lVar6 = RING_BUFFER_SIZE * counter;
  if ((long)(RING_BUFFER_SIZE * counter) < 1) {
    lVar6 = lVar7;
  }
  for (; lVar7 != lVar6; lVar7 = lVar7 + 1) {
    uVar3 = disruptor::
            Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_0>
            ::Claim(s,delta);
    uVar1 = (s->ring_buffer_).index_mask_;
    if (uVar3 < delta) {
      plVar2 = (s->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar4 = 0; lVar4 <= (long)uVar3; lVar4 = lVar4 + 1) {
        plVar2[(uint)lVar4 & uVar1] = lVar4;
      }
    }
    else {
      plVar2 = (s->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar5 = uVar3; uVar3 - delta < uVar5; uVar5 = uVar5 - 1) {
        plVar2[uVar5 & (long)(int)uVar1] = uVar5;
      }
    }
    (s->cursor_).sequence_.super___atomic_base<long>._M_i = uVar3;
  }
  return;
}

Assistant:

void produce(disruptor::Sequencer<T, C, W>& s) {
  int64_t iterations = counter * RING_BUFFER_SIZE;

  for (int64_t i = 0; i < iterations; ++i) {

    int64_t sequence = s.Claim(delta);

    if (sequence < delta) {
      for (int k = 0; k <= sequence; ++k) {
        s[k] = k;
#ifdef PRINT_DEBUG_PROD
        std::stringstream ss;
        ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id()
           << '\n';
        std::cout << ss.str();
#endif
      }

      s.Publish(sequence, delta);
      continue;
    }

    for (int64_t k = sequence; k > sequence - delta; --k) {
      s[k] = k;

#ifdef PRINT_DEBUG_PROD
      std::stringstream ss;
      ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
    }

    s.Publish(sequence, delta);
  }
}